

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  Op *pOVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  Op *pOVar4;
  uint p2;
  
  if ((pTab->tabFlags & 0x10000) == 0) {
    __s = pTab->zColAff;
    if (__s == (char *)0x0) {
      __s = sqlite3TableAffinityStr((sqlite3 *)0x0,pTab);
      if (__s == (char *)0x0) {
        sqlite3OomFault(v->db);
        return;
      }
      pTab->zColAff = __s;
    }
    sVar3 = strlen(__s);
    p2 = (uint)sVar3 & 0x3fffffff;
    if ((sVar3 & 0x3fffffff) != 0) {
      if (iReg == 0) {
        iVar2 = -1;
      }
      else {
        iVar2 = sqlite3VdbeAddOp3(v,0x60,iReg,p2,0);
      }
      sqlite3VdbeChangeP4(v,iVar2,__s,p2);
      return;
    }
  }
  else {
    if (iReg == 0) {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (v->db->mallocFailed == '\0') {
        pOVar1 = v->aOp;
        iVar2 = v->nOp;
        pOVar1[(long)iVar2 + -1].p4type = -5;
        pOVar1[(long)iVar2 + -1].p4.pTab = pTab;
        if (v->db->mallocFailed == '\0') {
          pOVar4 = v->aOp + (long)v->nOp + -1;
        }
      }
      pOVar4->opcode = '_';
      sqlite3VdbeAddOp3(v,0x61,pOVar4->p1,pOVar4->p2,pOVar4->p3);
      return;
    }
    sqlite3VdbeAddOp3(v,0x5f,iReg,(int)pTab->nNVCol,0);
    if (v->db->mallocFailed == '\0') {
      pOVar4 = v->aOp;
      iVar2 = v->nOp;
      pOVar4[(long)iVar2 + -1].p4type = -5;
      pOVar4[(long)iVar2 + -1].p4.pTab = pTab;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff;
  if( pTab->tabFlags & TF_Strict ){
    if( iReg==0 ){
      /* Move the previous opcode (which should be OP_MakeRecord) forward
      ** by one slot and insert a new OP_TypeCheck where the current
      ** OP_MakeRecord is found */
      VdbeOp *pPrev;
      sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
      pPrev = sqlite3VdbeGetLastOp(v);
      assert( pPrev!=0 );
      assert( pPrev->opcode==OP_MakeRecord || sqlite3VdbeDb(v)->mallocFailed );
      pPrev->opcode = OP_TypeCheck;
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pPrev->p1, pPrev->p2, pPrev->p3);
    }else{
      /* Insert an isolated OP_Typecheck */
      sqlite3VdbeAddOp2(v, OP_TypeCheck, iReg, pTab->nNVCol);
      sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
    }
    return;
  }
  zColAff = pTab->zColAff;
  if( zColAff==0 ){
    zColAff = sqlite3TableAffinityStr(0, pTab);
    if( !zColAff ){
      sqlite3OomFault(sqlite3VdbeDb(v));
      return;
    }
    pTab->zColAff = zColAff;
  }
  assert( zColAff!=0 );
  i = sqlite3Strlen30NN(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      assert( sqlite3VdbeGetLastOp(v)->opcode==OP_MakeRecord
              || sqlite3VdbeDb(v)->mallocFailed );
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}